

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

Scl_Tree_t * Scl_LibertyStart(char *pFileName)

{
  int iVar1;
  abctime aVar2;
  char *pcVar3;
  void *pvVar4;
  Vec_Str_t *pVVar5;
  int RetValue;
  Scl_Tree_t *p;
  char *pFileName_local;
  
  Scl_LibertyFixFileName(pFileName);
  iVar1 = Scl_LibertyFileSize(pFileName);
  if (iVar1 == 0) {
    pFileName_local = (char *)0x0;
  }
  else {
    pFileName_local = (char *)malloc(0x40);
    memset(pFileName_local,0,0x40);
    aVar2 = Abc_Clock();
    *(abctime *)(pFileName_local + 0x30) = aVar2;
    *(int *)(pFileName_local + 0x10) = iVar1;
    pcVar3 = Scl_LibertyFileContents(pFileName,*(int *)(pFileName_local + 0x10));
    *(char **)(pFileName_local + 8) = pcVar3;
    pcVar3 = Abc_UtilStrsav(pFileName);
    *(char **)pFileName_local = pcVar3;
    iVar1 = Scl_LibertyCountItems
                      (*(char **)(pFileName_local + 8),
                       (char *)(*(long *)(pFileName_local + 8) +
                               (long)*(int *)(pFileName_local + 0x10)));
    *(int *)(pFileName_local + 0x1c) = iVar1 + 10;
    pvVar4 = calloc((long)*(int *)(pFileName_local + 0x1c),0x28);
    *(void **)(pFileName_local + 0x20) = pvVar4;
    pFileName_local[0x18] = '\0';
    pFileName_local[0x19] = '\0';
    pFileName_local[0x1a] = '\0';
    pFileName_local[0x1b] = '\0';
    pFileName_local[0x14] = '\x01';
    pFileName_local[0x15] = '\0';
    pFileName_local[0x16] = '\0';
    pFileName_local[0x17] = '\0';
    pVVar5 = Vec_StrStart(10);
    *(Vec_Str_t **)(pFileName_local + 0x38) = pVVar5;
  }
  return (Scl_Tree_t *)pFileName_local;
}

Assistant:

Scl_Tree_t * Scl_LibertyStart( char * pFileName )
{
    Scl_Tree_t * p;
    int RetValue;
    // read the file into the buffer
    Scl_LibertyFixFileName( pFileName );
    RetValue = Scl_LibertyFileSize( pFileName );
    if ( RetValue == 0 )
        return NULL;
    // start the manager
    p = ABC_ALLOC( Scl_Tree_t, 1 );
    memset( p, 0, sizeof(Scl_Tree_t) );
    p->clkStart  = Abc_Clock();
    p->nContents = RetValue;
    p->pContents = Scl_LibertyFileContents( pFileName, p->nContents );
    // other 
    p->pFileName = Abc_UtilStrsav( pFileName );
    p->nItermAlloc = 10 + Scl_LibertyCountItems( p->pContents, p->pContents+p->nContents );
    p->pItems = ABC_CALLOC( Scl_Item_t, p->nItermAlloc );
    p->nItems = 0;
    p->nLines = 1;
    p->vBuffer = Vec_StrStart( 10 );
    return p;
}